

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O0

void __thiscall libtorrent::aux::peer_list::set_failcount(peer_list *this,torrent_peer *p,int f)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int delta;
  bool was_conn_cand;
  int f_local;
  torrent_peer *p_local;
  peer_list *this_local;
  
  bVar1 = is_connect_candidate(this,p);
  uVar3 = numeric_cast<unsigned_int,int,void>(f);
  *(uint *)&p->field_0x1b = *(uint *)&p->field_0x1b & 0xffffffe0 | uVar3 & 0x1f;
  bVar2 = is_connect_candidate(this,p);
  if (bVar1 != bVar2) {
    delta = 1;
    if (bVar1) {
      delta = -1;
    }
    update_connect_candidates(this,delta);
  }
  return;
}

Assistant:

void peer_list::set_failcount(torrent_peer* p, int const f)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		TORRENT_ASSERT(p->in_use);
		bool const was_conn_cand = is_connect_candidate(*p);
		p->failcount = aux::numeric_cast<std::uint32_t>(f);
		if (was_conn_cand != is_connect_candidate(*p))
		{
			update_connect_candidates(was_conn_cand ? -1 : 1);
		}
	}